

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  uint uVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined4 uVar69;
  ulong unaff_R14;
  size_t mask;
  ulong uVar70;
  bool bVar71;
  bool bVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar103;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  float fVar117;
  float fVar122;
  float fVar123;
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_e10;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 *local_d00;
  ulong local_cf8;
  ulong local_cf0;
  ulong *local_ce8;
  undefined1 local_ce0 [32];
  RTCFilterFunctionNArguments local_cb0;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [32];
  undefined4 local_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined4 local_be0;
  undefined4 uStack_bdc;
  undefined4 uStack_bd8;
  undefined4 uStack_bd4;
  undefined1 local_bd0 [16];
  uint local_bc0;
  uint uStack_bbc;
  uint uStack_bb8;
  uint uStack_bb4;
  uint uStack_bb0;
  uint uStack_bac;
  uint uStack_ba8;
  uint uStack_ba4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 uStack_b84;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_e10 = local_7f8;
  local_800 = root.ptr;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar115._4_4_ = uVar69;
  auVar115._0_4_ = uVar69;
  auVar115._8_4_ = uVar69;
  auVar115._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar118._4_4_ = uVar69;
  auVar118._0_4_ = uVar69;
  auVar118._8_4_ = uVar69;
  auVar118._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar128._4_4_ = uVar69;
  auVar128._0_4_ = uVar69;
  auVar128._8_4_ = uVar69;
  auVar128._12_4_ = uVar69;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar34 = fVar1 * 0.99999964;
  fVar35 = fVar2 * 0.99999964;
  fVar36 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar4 = (tray->tnear).field_0.i[k];
  auVar93._4_4_ = iVar4;
  auVar93._0_4_ = iVar4;
  auVar93._8_4_ = iVar4;
  auVar93._12_4_ = iVar4;
  local_b80._16_16_ = mm_lookupmask_ps._240_16_;
  local_b80._0_16_ = mm_lookupmask_ps._0_16_;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar98._4_4_ = iVar4;
  auVar98._0_4_ = iVar4;
  auVar98._8_4_ = iVar4;
  auVar98._12_4_ = iVar4;
  local_d00 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = &DAT_3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar75._8_4_ = 0xbf800000;
  auVar75._0_8_ = 0xbf800000bf800000;
  auVar75._12_4_ = 0xbf800000;
  auVar75._16_4_ = 0xbf800000;
  auVar75._20_4_ = 0xbf800000;
  auVar75._24_4_ = 0xbf800000;
  auVar75._28_4_ = 0xbf800000;
  _local_ba0 = vblendvps_avx(auVar88,auVar75,local_b80);
  do {
    local_ce8 = local_e10;
    if (local_e10 == &local_800) break;
    uVar66 = local_e10[-1];
    local_e10 = local_e10 + -1;
    do {
      if ((uVar66 & 8) == 0) {
        auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar67),auVar115);
        auVar73._0_4_ = fVar34 * auVar74._0_4_;
        auVar73._4_4_ = fVar34 * auVar74._4_4_;
        auVar73._8_4_ = fVar34 * auVar74._8_4_;
        auVar73._12_4_ = fVar34 * auVar74._12_4_;
        auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar70),auVar118);
        auVar78._0_4_ = fVar35 * auVar74._0_4_;
        auVar78._4_4_ = fVar35 * auVar74._4_4_;
        auVar78._8_4_ = fVar35 * auVar74._8_4_;
        auVar78._12_4_ = fVar35 * auVar74._12_4_;
        auVar74 = vmaxps_avx(auVar73,auVar78);
        auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar68),auVar128);
        auVar79._0_4_ = fVar36 * auVar73._0_4_;
        auVar79._4_4_ = fVar36 * auVar73._4_4_;
        auVar79._8_4_ = fVar36 * auVar73._8_4_;
        auVar79._12_4_ = fVar36 * auVar73._12_4_;
        auVar73 = vmaxps_avx(auVar79,auVar93);
        auVar74 = vmaxps_avx(auVar74,auVar73);
        auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar67 ^ 0x10)),auVar115);
        auVar80._0_4_ = fVar1 * auVar73._0_4_;
        auVar80._4_4_ = fVar1 * auVar73._4_4_;
        auVar80._8_4_ = fVar1 * auVar73._8_4_;
        auVar80._12_4_ = fVar1 * auVar73._12_4_;
        auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar70 ^ 0x10)),auVar118);
        auVar85._0_4_ = fVar2 * auVar73._0_4_;
        auVar85._4_4_ = fVar2 * auVar73._4_4_;
        auVar85._8_4_ = fVar2 * auVar73._8_4_;
        auVar85._12_4_ = fVar2 * auVar73._12_4_;
        auVar73 = vminps_avx(auVar80,auVar85);
        auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + (uVar68 ^ 0x10)),auVar128);
        auVar86._0_4_ = fVar3 * auVar78._0_4_;
        auVar86._4_4_ = fVar3 * auVar78._4_4_;
        auVar86._8_4_ = fVar3 * auVar78._8_4_;
        auVar86._12_4_ = fVar3 * auVar78._12_4_;
        auVar78 = vminps_avx(auVar86,auVar98);
        auVar73 = vminps_avx(auVar73,auVar78);
        auVar74 = vcmpps_avx(auVar74,auVar73,2);
        uVar69 = vmovmskps_avx(auVar74);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar69);
      }
      if ((uVar66 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar60 = 4;
        }
        else {
          uVar65 = uVar66 & 0xfffffffffffffff0;
          lVar63 = 0;
          for (uVar66 = unaff_R14; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
            lVar63 = lVar63 + 1;
          }
          for (uVar61 = unaff_R14 - 1 & unaff_R14; uVar66 = *(ulong *)(uVar65 + lVar63 * 8),
              uVar61 != 0; uVar61 = uVar61 - 1 & uVar61) {
            *local_e10 = uVar66;
            local_e10 = local_e10 + 1;
            lVar63 = 0;
            for (uVar66 = uVar61; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
              lVar63 = lVar63 + 1;
            }
          }
          uVar60 = 0;
        }
      }
      else {
        uVar60 = 6;
      }
    } while (uVar60 == 0);
    if (uVar60 == 6) {
      uVar60 = 0;
      local_cf8 = (ulong)((uint)uVar66 & 0xf) - 8;
      bVar71 = local_cf8 != 0;
      if (bVar71) {
        uVar66 = uVar66 & 0xfffffffffffffff0;
        local_cf0 = 0;
        do {
          lVar62 = local_cf0 * 0x60;
          pSVar5 = context->scene;
          ppfVar6 = (pSVar5->vertices).items;
          pfVar7 = ppfVar6[*(uint *)(uVar66 + 0x40 + lVar62)];
          auVar89._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x20 + lVar62));
          auVar89._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + lVar62));
          pfVar8 = ppfVar6[*(uint *)(uVar66 + 0x48 + lVar62)];
          auVar94._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar66 + 0x28 + lVar62));
          auVar94._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar66 + 8 + lVar62));
          pfVar9 = ppfVar6[*(uint *)(uVar66 + 0x44 + lVar62)];
          auVar104._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0x24 + lVar62));
          auVar104._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 4 + lVar62));
          pfVar10 = ppfVar6[*(uint *)(uVar66 + 0x4c + lVar62)];
          auVar129._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar66 + 0x2c + lVar62));
          auVar129._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar66 + 0xc + lVar62));
          lVar63 = uVar66 + 0x40 + lVar62;
          local_9e0 = *(undefined8 *)(lVar63 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar63 + 0x18);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          lVar63 = uVar66 + 0x50 + lVar62;
          local_a00 = *(undefined8 *)(lVar63 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar63 + 0x18);
          auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x10 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x18 + lVar62)));
          auVar74 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x10 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x18 + lVar62)));
          auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0x14 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar66 + 0x1c + lVar62)));
          auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0x14 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar66 + 0x1c + lVar62)));
          auVar80 = vunpcklps_avx(auVar74,auVar73);
          auVar85 = vunpcklps_avx(auVar78,auVar79);
          auVar74 = vunpckhps_avx(auVar78,auVar79);
          auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x30 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x38 + lVar62)));
          auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar66 + 0x30 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar66 + 0x38 + lVar62)));
          auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0x34 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar66 + 0x3c + lVar62)));
          auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar66 + 0x34 + lVar62))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar66 + 0x3c + lVar62)));
          auVar78 = vunpcklps_avx(auVar73,auVar78);
          auVar39 = vunpcklps_avx(auVar79,auVar86);
          auVar73 = vunpckhps_avx(auVar79,auVar86);
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar75 = vunpcklps_avx(auVar104,auVar129);
          auVar88 = vunpcklps_avx(auVar89,auVar94);
          auVar40 = vunpcklps_avx(auVar88,auVar75);
          auVar75 = vunpckhps_avx(auVar88,auVar75);
          auVar88 = vunpckhps_avx(auVar104,auVar129);
          auVar84 = vunpckhps_avx(auVar89,auVar94);
          auVar88 = vunpcklps_avx(auVar84,auVar88);
          auVar95._16_16_ = auVar85;
          auVar95._0_16_ = auVar85;
          auVar105._16_16_ = auVar74;
          auVar105._0_16_ = auVar74;
          auVar116._16_16_ = auVar80;
          auVar116._0_16_ = auVar80;
          auVar135._16_16_ = auVar39;
          auVar135._0_16_ = auVar39;
          auVar99._16_16_ = auVar73;
          auVar99._0_16_ = auVar73;
          uVar69 = *(undefined4 *)(ray + k * 4);
          auVar119._4_4_ = uVar69;
          auVar119._0_4_ = uVar69;
          auVar119._8_4_ = uVar69;
          auVar119._12_4_ = uVar69;
          auVar119._16_4_ = uVar69;
          auVar119._20_4_ = uVar69;
          auVar119._24_4_ = uVar69;
          auVar119._28_4_ = uVar69;
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar130._4_4_ = uVar69;
          auVar130._0_4_ = uVar69;
          auVar130._8_4_ = uVar69;
          auVar130._12_4_ = uVar69;
          auVar130._16_4_ = uVar69;
          auVar130._20_4_ = uVar69;
          auVar130._24_4_ = uVar69;
          auVar130._28_4_ = uVar69;
          auVar76._16_16_ = auVar78;
          auVar76._0_16_ = auVar78;
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar134._4_4_ = uVar69;
          auVar134._0_4_ = uVar69;
          auVar134._8_4_ = uVar69;
          auVar134._12_4_ = uVar69;
          auVar134._16_4_ = uVar69;
          auVar134._20_4_ = uVar69;
          auVar134._24_4_ = uVar69;
          auVar134._28_4_ = uVar69;
          local_a20 = vsubps_avx(auVar40,auVar119);
          local_a40 = vsubps_avx(auVar75,auVar130);
          local_a60 = vsubps_avx(auVar88,auVar134);
          auVar75 = vsubps_avx(auVar95,auVar119);
          auVar88 = vsubps_avx(auVar105,auVar130);
          auVar84 = vsubps_avx(auVar116,auVar134);
          auVar40 = vsubps_avx(auVar135,auVar119);
          auVar89 = vsubps_avx(auVar99,auVar130);
          auVar37 = vsubps_avx(auVar76,auVar134);
          local_a80 = vsubps_avx(auVar40,local_a20);
          local_ac0 = vsubps_avx(auVar89,local_a40);
          local_aa0 = vsubps_avx(auVar37,local_a60);
          auVar77._0_4_ = auVar40._0_4_ + local_a20._0_4_;
          auVar77._4_4_ = auVar40._4_4_ + local_a20._4_4_;
          auVar77._8_4_ = auVar40._8_4_ + local_a20._8_4_;
          auVar77._12_4_ = auVar40._12_4_ + local_a20._12_4_;
          auVar77._16_4_ = auVar40._16_4_ + local_a20._16_4_;
          auVar77._20_4_ = auVar40._20_4_ + local_a20._20_4_;
          auVar77._24_4_ = auVar40._24_4_ + local_a20._24_4_;
          auVar77._28_4_ = auVar40._28_4_ + local_a20._28_4_;
          auVar96._0_4_ = auVar89._0_4_ + local_a40._0_4_;
          auVar96._4_4_ = auVar89._4_4_ + local_a40._4_4_;
          auVar96._8_4_ = auVar89._8_4_ + local_a40._8_4_;
          auVar96._12_4_ = auVar89._12_4_ + local_a40._12_4_;
          auVar96._16_4_ = auVar89._16_4_ + local_a40._16_4_;
          auVar96._20_4_ = auVar89._20_4_ + local_a40._20_4_;
          auVar96._24_4_ = auVar89._24_4_ + local_a40._24_4_;
          fVar103 = local_a40._28_4_;
          auVar96._28_4_ = auVar89._28_4_ + fVar103;
          fVar13 = local_a60._0_4_;
          auVar100._0_4_ = auVar37._0_4_ + fVar13;
          fVar14 = local_a60._4_4_;
          auVar100._4_4_ = auVar37._4_4_ + fVar14;
          fVar15 = local_a60._8_4_;
          auVar100._8_4_ = auVar37._8_4_ + fVar15;
          fVar16 = local_a60._12_4_;
          auVar100._12_4_ = auVar37._12_4_ + fVar16;
          fVar17 = local_a60._16_4_;
          auVar100._16_4_ = auVar37._16_4_ + fVar17;
          fVar18 = local_a60._20_4_;
          auVar100._20_4_ = auVar37._20_4_ + fVar18;
          fVar19 = local_a60._24_4_;
          auVar100._24_4_ = auVar37._24_4_ + fVar19;
          auVar100._28_4_ = auVar37._28_4_ + local_a60._28_4_;
          auVar38._4_4_ = local_aa0._4_4_ * auVar96._4_4_;
          auVar38._0_4_ = local_aa0._0_4_ * auVar96._0_4_;
          auVar38._8_4_ = local_aa0._8_4_ * auVar96._8_4_;
          auVar38._12_4_ = local_aa0._12_4_ * auVar96._12_4_;
          auVar38._16_4_ = local_aa0._16_4_ * auVar96._16_4_;
          auVar38._20_4_ = local_aa0._20_4_ * auVar96._20_4_;
          auVar38._24_4_ = local_aa0._24_4_ * auVar96._24_4_;
          auVar38._28_4_ = auVar39._12_4_;
          auVar73 = vfmsub231ps_fma(auVar38,local_ac0,auVar100);
          auVar41._4_4_ = local_a80._4_4_ * auVar100._4_4_;
          auVar41._0_4_ = local_a80._0_4_ * auVar100._0_4_;
          auVar41._8_4_ = local_a80._8_4_ * auVar100._8_4_;
          auVar41._12_4_ = local_a80._12_4_ * auVar100._12_4_;
          auVar41._16_4_ = local_a80._16_4_ * auVar100._16_4_;
          auVar41._20_4_ = local_a80._20_4_ * auVar100._20_4_;
          auVar41._24_4_ = local_a80._24_4_ * auVar100._24_4_;
          auVar41._28_4_ = auVar100._28_4_;
          auVar74 = vfmsub231ps_fma(auVar41,local_aa0,auVar77);
          auVar42._4_4_ = auVar77._4_4_ * local_ac0._4_4_;
          auVar42._0_4_ = auVar77._0_4_ * local_ac0._0_4_;
          auVar42._8_4_ = auVar77._8_4_ * local_ac0._8_4_;
          auVar42._12_4_ = auVar77._12_4_ * local_ac0._12_4_;
          auVar42._16_4_ = auVar77._16_4_ * local_ac0._16_4_;
          auVar42._20_4_ = auVar77._20_4_ * local_ac0._20_4_;
          auVar42._24_4_ = auVar77._24_4_ * local_ac0._24_4_;
          auVar42._28_4_ = auVar77._28_4_;
          auVar78 = vfmsub231ps_fma(auVar42,local_a80,auVar96);
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x50);
          local_ce0._4_4_ = uVar69;
          local_ce0._0_4_ = uVar69;
          local_ce0._8_4_ = uVar69;
          local_ce0._12_4_ = uVar69;
          local_ce0._16_4_ = uVar69;
          local_ce0._20_4_ = uVar69;
          local_ce0._24_4_ = uVar69;
          local_ce0._28_4_ = uVar69;
          fStack_c7c = *(float *)(ray + k * 4 + 0x60);
          auVar43._4_4_ = fStack_c7c * auVar78._4_4_;
          auVar43._0_4_ = fStack_c7c * auVar78._0_4_;
          auVar43._8_4_ = fStack_c7c * auVar78._8_4_;
          auVar43._12_4_ = fStack_c7c * auVar78._12_4_;
          auVar43._16_4_ = fStack_c7c * 0.0;
          auVar43._20_4_ = fStack_c7c * 0.0;
          auVar43._24_4_ = fStack_c7c * 0.0;
          auVar43._28_4_ = local_aa0._28_4_;
          auVar74 = vfmadd231ps_fma(auVar43,local_ce0,ZEXT1632(auVar74));
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_c60._4_4_ = uVar69;
          local_c60._0_4_ = uVar69;
          local_c60._8_4_ = uVar69;
          local_c60._12_4_ = uVar69;
          local_c60._16_4_ = uVar69;
          local_c60._20_4_ = uVar69;
          local_c60._24_4_ = uVar69;
          local_c60._28_4_ = uVar69;
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),local_c60,ZEXT1632(auVar73));
          local_ae0 = vsubps_avx(local_a40,auVar88);
          local_b20 = vsubps_avx(local_a60,auVar84);
          auVar97._0_4_ = local_a40._0_4_ + auVar88._0_4_;
          auVar97._4_4_ = local_a40._4_4_ + auVar88._4_4_;
          auVar97._8_4_ = local_a40._8_4_ + auVar88._8_4_;
          auVar97._12_4_ = local_a40._12_4_ + auVar88._12_4_;
          auVar97._16_4_ = local_a40._16_4_ + auVar88._16_4_;
          auVar97._20_4_ = local_a40._20_4_ + auVar88._20_4_;
          auVar97._24_4_ = local_a40._24_4_ + auVar88._24_4_;
          auVar97._28_4_ = fVar103 + auVar88._28_4_;
          auVar101._0_4_ = auVar84._0_4_ + fVar13;
          auVar101._4_4_ = auVar84._4_4_ + fVar14;
          auVar101._8_4_ = auVar84._8_4_ + fVar15;
          auVar101._12_4_ = auVar84._12_4_ + fVar16;
          auVar101._16_4_ = auVar84._16_4_ + fVar17;
          auVar101._20_4_ = auVar84._20_4_ + fVar18;
          auVar101._24_4_ = auVar84._24_4_ + fVar19;
          auVar101._28_4_ = auVar84._28_4_ + local_a60._28_4_;
          fVar107 = local_b20._0_4_;
          fVar109 = local_b20._4_4_;
          auVar44._4_4_ = auVar97._4_4_ * fVar109;
          auVar44._0_4_ = auVar97._0_4_ * fVar107;
          fVar112 = local_b20._8_4_;
          auVar44._8_4_ = auVar97._8_4_ * fVar112;
          fVar22 = local_b20._12_4_;
          auVar44._12_4_ = auVar97._12_4_ * fVar22;
          fVar25 = local_b20._16_4_;
          auVar44._16_4_ = auVar97._16_4_ * fVar25;
          fVar28 = local_b20._20_4_;
          auVar44._20_4_ = auVar97._20_4_ * fVar28;
          fVar31 = local_b20._24_4_;
          auVar44._24_4_ = auVar97._24_4_ * fVar31;
          auVar44._28_4_ = fVar103;
          auVar78 = vfmsub231ps_fma(auVar44,local_ae0,auVar101);
          local_b00 = vsubps_avx(local_a20,auVar75);
          fVar103 = local_b00._0_4_;
          fVar110 = local_b00._4_4_;
          auVar45._4_4_ = auVar101._4_4_ * fVar110;
          auVar45._0_4_ = auVar101._0_4_ * fVar103;
          fVar20 = local_b00._8_4_;
          auVar45._8_4_ = auVar101._8_4_ * fVar20;
          fVar23 = local_b00._12_4_;
          auVar45._12_4_ = auVar101._12_4_ * fVar23;
          fVar26 = local_b00._16_4_;
          auVar45._16_4_ = auVar101._16_4_ * fVar26;
          fVar29 = local_b00._20_4_;
          auVar45._20_4_ = auVar101._20_4_ * fVar29;
          fVar32 = local_b00._24_4_;
          auVar45._24_4_ = auVar101._24_4_ * fVar32;
          auVar45._28_4_ = auVar101._28_4_;
          auVar120._0_4_ = auVar75._0_4_ + local_a20._0_4_;
          auVar120._4_4_ = auVar75._4_4_ + local_a20._4_4_;
          auVar120._8_4_ = auVar75._8_4_ + local_a20._8_4_;
          auVar120._12_4_ = auVar75._12_4_ + local_a20._12_4_;
          auVar120._16_4_ = auVar75._16_4_ + local_a20._16_4_;
          auVar120._20_4_ = auVar75._20_4_ + local_a20._20_4_;
          auVar120._24_4_ = auVar75._24_4_ + local_a20._24_4_;
          auVar120._28_4_ = auVar75._28_4_ + local_a20._28_4_;
          auVar73 = vfmsub231ps_fma(auVar45,local_b20,auVar120);
          fVar108 = local_ae0._0_4_;
          fVar111 = local_ae0._4_4_;
          auVar46._4_4_ = auVar120._4_4_ * fVar111;
          auVar46._0_4_ = auVar120._0_4_ * fVar108;
          fVar21 = local_ae0._8_4_;
          auVar46._8_4_ = auVar120._8_4_ * fVar21;
          fVar24 = local_ae0._12_4_;
          auVar46._12_4_ = auVar120._12_4_ * fVar24;
          fVar27 = local_ae0._16_4_;
          auVar46._16_4_ = auVar120._16_4_ * fVar27;
          fVar30 = local_ae0._20_4_;
          auVar46._20_4_ = auVar120._20_4_ * fVar30;
          fVar33 = local_ae0._24_4_;
          auVar46._24_4_ = auVar120._24_4_ * fVar33;
          auVar46._28_4_ = auVar120._28_4_;
          auVar79 = vfmsub231ps_fma(auVar46,local_b00,auVar97);
          auVar47._4_4_ = auVar79._4_4_ * fStack_c7c;
          auVar47._0_4_ = auVar79._0_4_ * fStack_c7c;
          auVar47._8_4_ = auVar79._8_4_ * fStack_c7c;
          auVar47._12_4_ = auVar79._12_4_ * fStack_c7c;
          auVar47._16_4_ = fStack_c7c * 0.0;
          auVar47._20_4_ = fStack_c7c * 0.0;
          auVar47._24_4_ = fStack_c7c * 0.0;
          auVar47._28_4_ = local_b20._28_4_;
          auVar73 = vfmadd231ps_fma(auVar47,local_ce0,ZEXT1632(auVar73));
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_c60,ZEXT1632(auVar78));
          auVar38 = vsubps_avx(auVar75,auVar40);
          auVar90._0_4_ = auVar75._0_4_ + auVar40._0_4_;
          auVar90._4_4_ = auVar75._4_4_ + auVar40._4_4_;
          auVar90._8_4_ = auVar75._8_4_ + auVar40._8_4_;
          auVar90._12_4_ = auVar75._12_4_ + auVar40._12_4_;
          auVar90._16_4_ = auVar75._16_4_ + auVar40._16_4_;
          auVar90._20_4_ = auVar75._20_4_ + auVar40._20_4_;
          auVar90._24_4_ = auVar75._24_4_ + auVar40._24_4_;
          auVar90._28_4_ = auVar75._28_4_ + auVar40._28_4_;
          auVar40 = vsubps_avx(auVar88,auVar89);
          auVar106._0_4_ = auVar88._0_4_ + auVar89._0_4_;
          auVar106._4_4_ = auVar88._4_4_ + auVar89._4_4_;
          auVar106._8_4_ = auVar88._8_4_ + auVar89._8_4_;
          auVar106._12_4_ = auVar88._12_4_ + auVar89._12_4_;
          auVar106._16_4_ = auVar88._16_4_ + auVar89._16_4_;
          auVar106._20_4_ = auVar88._20_4_ + auVar89._20_4_;
          auVar106._24_4_ = auVar88._24_4_ + auVar89._24_4_;
          auVar106._28_4_ = auVar88._28_4_ + auVar89._28_4_;
          auVar89 = vsubps_avx(auVar84,auVar37);
          auVar81._0_4_ = auVar84._0_4_ + auVar37._0_4_;
          auVar81._4_4_ = auVar84._4_4_ + auVar37._4_4_;
          auVar81._8_4_ = auVar84._8_4_ + auVar37._8_4_;
          auVar81._12_4_ = auVar84._12_4_ + auVar37._12_4_;
          auVar81._16_4_ = auVar84._16_4_ + auVar37._16_4_;
          auVar81._20_4_ = auVar84._20_4_ + auVar37._20_4_;
          auVar81._24_4_ = auVar84._24_4_ + auVar37._24_4_;
          auVar81._28_4_ = auVar84._28_4_ + auVar37._28_4_;
          auVar113._0_4_ = auVar89._0_4_ * auVar106._0_4_;
          auVar113._4_4_ = auVar89._4_4_ * auVar106._4_4_;
          auVar113._8_4_ = auVar89._8_4_ * auVar106._8_4_;
          auVar113._12_4_ = auVar89._12_4_ * auVar106._12_4_;
          auVar113._16_4_ = auVar89._16_4_ * auVar106._16_4_;
          auVar113._20_4_ = auVar89._20_4_ * auVar106._20_4_;
          auVar113._24_4_ = auVar89._24_4_ * auVar106._24_4_;
          auVar113._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar113,auVar40,auVar81);
          auVar84._4_4_ = auVar81._4_4_ * auVar38._4_4_;
          auVar84._0_4_ = auVar81._0_4_ * auVar38._0_4_;
          auVar84._8_4_ = auVar81._8_4_ * auVar38._8_4_;
          auVar84._12_4_ = auVar81._12_4_ * auVar38._12_4_;
          auVar84._16_4_ = auVar81._16_4_ * auVar38._16_4_;
          auVar84._20_4_ = auVar81._20_4_ * auVar38._20_4_;
          auVar84._24_4_ = auVar81._24_4_ * auVar38._24_4_;
          auVar84._28_4_ = auVar81._28_4_;
          auVar78 = vfmsub231ps_fma(auVar84,auVar89,auVar90);
          auVar37._4_4_ = auVar90._4_4_ * auVar40._4_4_;
          auVar37._0_4_ = auVar90._0_4_ * auVar40._0_4_;
          auVar37._8_4_ = auVar90._8_4_ * auVar40._8_4_;
          auVar37._12_4_ = auVar90._12_4_ * auVar40._12_4_;
          auVar37._16_4_ = auVar90._16_4_ * auVar40._16_4_;
          auVar37._20_4_ = auVar90._20_4_ * auVar40._20_4_;
          auVar37._24_4_ = auVar90._24_4_ * auVar40._24_4_;
          auVar37._28_4_ = auVar90._28_4_;
          auVar80 = vfmsub231ps_fma(auVar37,auVar38,auVar106);
          local_c80 = fStack_c7c;
          fStack_c78 = fStack_c7c;
          fStack_c74 = fStack_c7c;
          fStack_c70 = fStack_c7c;
          fStack_c6c = fStack_c7c;
          fStack_c68 = fStack_c7c;
          fStack_c64 = fStack_c7c;
          auVar91._0_4_ = fStack_c7c * auVar80._0_4_;
          auVar91._4_4_ = fStack_c7c * auVar80._4_4_;
          auVar91._8_4_ = fStack_c7c * auVar80._8_4_;
          auVar91._12_4_ = fStack_c7c * auVar80._12_4_;
          auVar91._16_4_ = fStack_c7c * 0.0;
          auVar91._20_4_ = fStack_c7c * 0.0;
          auVar91._24_4_ = fStack_c7c * 0.0;
          auVar91._28_4_ = 0;
          auVar78 = vfmadd231ps_fma(auVar91,local_ce0,ZEXT1632(auVar78));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_c60,ZEXT1632(auVar79));
          local_9c0 = auVar74._0_4_;
          fStack_9bc = auVar74._4_4_;
          fStack_9b8 = auVar74._8_4_;
          fStack_9b4 = auVar74._12_4_;
          local_980 = ZEXT1632(CONCAT412(auVar78._12_4_ + fStack_9b4 + auVar73._12_4_,
                                         CONCAT48(auVar78._8_4_ + fStack_9b8 + auVar73._8_4_,
                                                  CONCAT44(auVar78._4_4_ +
                                                           fStack_9bc + auVar73._4_4_,
                                                           auVar78._0_4_ + local_9c0 + auVar73._0_4_
                                                          ))));
          auVar82._8_4_ = 0x7fffffff;
          auVar82._0_8_ = 0x7fffffff7fffffff;
          auVar82._12_4_ = 0x7fffffff;
          auVar82._16_4_ = 0x7fffffff;
          auVar82._20_4_ = 0x7fffffff;
          auVar82._24_4_ = 0x7fffffff;
          auVar82._28_4_ = 0x7fffffff;
          local_b40 = ZEXT1632(auVar74);
          auVar75 = vminps_avx(local_b40,ZEXT1632(auVar73));
          auVar75 = vminps_avx(auVar75,ZEXT1632(auVar78));
          local_b60 = vandps_avx(local_980,auVar82);
          fVar117 = local_b60._0_4_ * 1.1920929e-07;
          fVar122 = local_b60._4_4_ * 1.1920929e-07;
          auVar48._4_4_ = fVar122;
          auVar48._0_4_ = fVar117;
          fVar123 = local_b60._8_4_ * 1.1920929e-07;
          auVar48._8_4_ = fVar123;
          fVar124 = local_b60._12_4_ * 1.1920929e-07;
          auVar48._12_4_ = fVar124;
          fVar125 = local_b60._16_4_ * 1.1920929e-07;
          auVar48._16_4_ = fVar125;
          fVar126 = local_b60._20_4_ * 1.1920929e-07;
          auVar48._20_4_ = fVar126;
          fVar127 = local_b60._24_4_ * 1.1920929e-07;
          auVar48._24_4_ = fVar127;
          auVar48._28_4_ = 0x34000000;
          auVar114._0_8_ = CONCAT44(fVar122,fVar117) ^ 0x8000000080000000;
          auVar114._8_4_ = -fVar123;
          auVar114._12_4_ = -fVar124;
          auVar114._16_4_ = -fVar125;
          auVar114._20_4_ = -fVar126;
          auVar114._24_4_ = -fVar127;
          auVar114._28_4_ = 0xb4000000;
          auVar75 = vcmpps_avx(auVar75,auVar114,5);
          auVar84 = vmaxps_avx(local_b40,ZEXT1632(auVar73));
          auVar88 = vmaxps_avx(auVar84,ZEXT1632(auVar78));
          auVar88 = vcmpps_avx(auVar88,auVar48,2);
          auVar88 = vorps_avx(auVar75,auVar88);
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar49._4_4_ = local_aa0._4_4_ * fVar111;
            auVar49._0_4_ = local_aa0._0_4_ * fVar108;
            auVar49._8_4_ = local_aa0._8_4_ * fVar21;
            auVar49._12_4_ = local_aa0._12_4_ * fVar24;
            auVar49._16_4_ = local_aa0._16_4_ * fVar27;
            auVar49._20_4_ = local_aa0._20_4_ * fVar30;
            auVar49._24_4_ = local_aa0._24_4_ * fVar33;
            auVar49._28_4_ = auVar75._28_4_;
            auVar50._4_4_ = fVar110 * local_ac0._4_4_;
            auVar50._0_4_ = fVar103 * local_ac0._0_4_;
            auVar50._8_4_ = fVar20 * local_ac0._8_4_;
            auVar50._12_4_ = fVar23 * local_ac0._12_4_;
            auVar50._16_4_ = fVar26 * local_ac0._16_4_;
            auVar50._20_4_ = fVar29 * local_ac0._20_4_;
            auVar50._24_4_ = fVar32 * local_ac0._24_4_;
            auVar50._28_4_ = 0x34000000;
            auVar74 = vfmsub213ps_fma(local_ac0,local_b20,auVar49);
            auVar51._4_4_ = fVar109 * auVar40._4_4_;
            auVar51._0_4_ = fVar107 * auVar40._0_4_;
            auVar51._8_4_ = fVar112 * auVar40._8_4_;
            auVar51._12_4_ = fVar22 * auVar40._12_4_;
            auVar51._16_4_ = fVar25 * auVar40._16_4_;
            auVar51._20_4_ = fVar28 * auVar40._20_4_;
            auVar51._24_4_ = fVar31 * auVar40._24_4_;
            auVar51._28_4_ = auVar84._28_4_;
            auVar131._0_4_ = fVar103 * auVar89._0_4_;
            auVar131._4_4_ = fVar110 * auVar89._4_4_;
            auVar131._8_4_ = fVar20 * auVar89._8_4_;
            auVar131._12_4_ = fVar23 * auVar89._12_4_;
            auVar131._16_4_ = fVar26 * auVar89._16_4_;
            auVar131._20_4_ = fVar29 * auVar89._20_4_;
            auVar131._24_4_ = fVar32 * auVar89._24_4_;
            auVar131._28_4_ = 0;
            auVar78 = vfmsub213ps_fma(auVar89,local_ae0,auVar51);
            auVar75 = vandps_avx(auVar49,auVar82);
            auVar84 = vandps_avx(auVar51,auVar82);
            auVar75 = vcmpps_avx(auVar75,auVar84,1);
            local_960 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar74),auVar75);
            auVar52._4_4_ = auVar38._4_4_ * fVar111;
            auVar52._0_4_ = auVar38._0_4_ * fVar108;
            auVar52._8_4_ = auVar38._8_4_ * fVar21;
            auVar52._12_4_ = auVar38._12_4_ * fVar24;
            auVar52._16_4_ = auVar38._16_4_ * fVar27;
            auVar52._20_4_ = auVar38._20_4_ * fVar30;
            auVar52._24_4_ = auVar38._24_4_ * fVar33;
            auVar52._28_4_ = auVar75._28_4_;
            auVar74 = vfmsub213ps_fma(auVar38,local_b20,auVar131);
            auVar53._4_4_ = local_a80._4_4_ * fVar109;
            auVar53._0_4_ = local_a80._0_4_ * fVar107;
            auVar53._8_4_ = local_a80._8_4_ * fVar112;
            auVar53._12_4_ = local_a80._12_4_ * fVar22;
            auVar53._16_4_ = local_a80._16_4_ * fVar25;
            auVar53._20_4_ = local_a80._20_4_ * fVar28;
            auVar53._24_4_ = local_a80._24_4_ * fVar31;
            auVar53._28_4_ = auVar84._28_4_;
            auVar78 = vfmsub213ps_fma(local_aa0,local_b00,auVar53);
            auVar75 = vandps_avx(auVar53,auVar82);
            auVar84 = vandps_avx(auVar131,auVar82);
            auVar75 = vcmpps_avx(auVar75,auVar84,1);
            local_940 = vblendvps_avx(ZEXT1632(auVar74),ZEXT1632(auVar78),auVar75);
            auVar74 = vfmsub213ps_fma(local_a80,local_ae0,auVar50);
            auVar78 = vfmsub213ps_fma(auVar40,local_b00,auVar52);
            auVar75 = vandps_avx(auVar50,auVar82);
            auVar84 = vandps_avx(auVar52,auVar82);
            auVar75 = vcmpps_avx(auVar75,auVar84,1);
            local_920 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar74),auVar75);
            auVar74 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            fVar103 = local_920._0_4_;
            auVar83._0_4_ = fVar103 * fStack_c7c;
            fVar107 = local_920._4_4_;
            auVar83._4_4_ = fVar107 * fStack_c7c;
            fVar108 = local_920._8_4_;
            auVar83._8_4_ = fVar108 * fStack_c7c;
            fVar109 = local_920._12_4_;
            auVar83._12_4_ = fVar109 * fStack_c7c;
            fVar110 = local_920._16_4_;
            auVar83._16_4_ = fVar110 * fStack_c7c;
            fVar111 = local_920._20_4_;
            auVar83._20_4_ = fVar111 * fStack_c7c;
            fVar112 = local_920._24_4_;
            auVar83._24_4_ = fVar112 * fStack_c7c;
            auVar83._28_4_ = 0;
            auVar78 = vfmadd213ps_fma(local_ce0,local_940,auVar83);
            auVar78 = vfmadd213ps_fma(local_c60,local_960,ZEXT1632(auVar78));
            auVar84 = ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                         CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                  CONCAT44(auVar78._4_4_ + auVar78._4_4_,
                                                           auVar78._0_4_ + auVar78._0_4_))));
            auVar40._4_4_ = fVar107 * fVar14;
            auVar40._0_4_ = fVar103 * fVar13;
            auVar40._8_4_ = fVar108 * fVar15;
            auVar40._12_4_ = fVar109 * fVar16;
            auVar40._16_4_ = fVar110 * fVar17;
            auVar40._20_4_ = fVar111 * fVar18;
            auVar40._24_4_ = fVar112 * fVar19;
            auVar40._28_4_ = auVar88._28_4_;
            auVar78 = vfmadd213ps_fma(local_a40,local_940,auVar40);
            auVar79 = vfmadd213ps_fma(local_a20,local_960,ZEXT1632(auVar78));
            auVar75 = vrcpps_avx(auVar84);
            auVar133._8_4_ = 0x3f800000;
            auVar133._0_8_ = &DAT_3f8000003f800000;
            auVar133._12_4_ = 0x3f800000;
            auVar133._16_4_ = 0x3f800000;
            auVar133._20_4_ = 0x3f800000;
            auVar133._24_4_ = 0x3f800000;
            auVar133._28_4_ = 0x3f800000;
            auVar78 = vfnmadd213ps_fma(auVar75,auVar84,auVar133);
            auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar75,auVar75);
            local_8a0 = ZEXT1632(CONCAT412(auVar78._12_4_ * (auVar79._12_4_ + auVar79._12_4_),
                                           CONCAT48(auVar78._8_4_ * (auVar79._8_4_ + auVar79._8_4_),
                                                    CONCAT44(auVar78._4_4_ *
                                                             (auVar79._4_4_ + auVar79._4_4_),
                                                             auVar78._0_4_ *
                                                             (auVar79._0_4_ + auVar79._0_4_)))));
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar121._4_4_ = uVar69;
            auVar121._0_4_ = uVar69;
            auVar121._8_4_ = uVar69;
            auVar121._12_4_ = uVar69;
            auVar121._16_4_ = uVar69;
            auVar121._20_4_ = uVar69;
            auVar121._24_4_ = uVar69;
            auVar121._28_4_ = uVar69;
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar132._4_4_ = uVar69;
            auVar132._0_4_ = uVar69;
            auVar132._8_4_ = uVar69;
            auVar132._12_4_ = uVar69;
            auVar132._16_4_ = uVar69;
            auVar132._20_4_ = uVar69;
            auVar132._24_4_ = uVar69;
            auVar132._28_4_ = uVar69;
            auVar75 = vcmpps_avx(auVar121,local_8a0,2);
            auVar88 = vcmpps_avx(local_8a0,auVar132,2);
            auVar75 = vandps_avx(auVar75,auVar88);
            auVar78 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
            auVar74 = vpand_avx(auVar78,auVar74);
            auVar75 = vpmovsxwd_avx2(auVar74);
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              auVar75 = vcmpps_avx(auVar84,_DAT_02020f00,4);
              auVar78 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
              auVar74 = vpand_avx(auVar74,auVar78);
              local_900 = vpmovsxwd_avx2(auVar74);
              if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_900 >> 0x7f,0) != '\0') ||
                    (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_900 >> 0xbf,0) != '\0') ||
                  (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_900[0x1f] < '\0') {
                uStack_9b0 = 0;
                uStack_9ac = 0;
                uStack_9a8 = 0;
                uStack_9a4 = 0;
                local_9a0 = ZEXT1632(auVar73);
                local_820 = local_b80;
                auVar75 = vrcpps_avx(local_980);
                auVar102._8_4_ = 0x3f800000;
                auVar102._0_8_ = &DAT_3f8000003f800000;
                auVar102._12_4_ = 0x3f800000;
                auVar102._16_4_ = 0x3f800000;
                auVar102._20_4_ = 0x3f800000;
                auVar102._24_4_ = 0x3f800000;
                auVar102._28_4_ = 0x3f800000;
                auVar78 = vfnmadd213ps_fma(local_980,auVar75,auVar102);
                auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar75,auVar75);
                auVar92._8_4_ = 0x219392ef;
                auVar92._0_8_ = 0x219392ef219392ef;
                auVar92._12_4_ = 0x219392ef;
                auVar92._16_4_ = 0x219392ef;
                auVar92._20_4_ = 0x219392ef;
                auVar92._24_4_ = 0x219392ef;
                auVar92._28_4_ = 0x219392ef;
                auVar75 = vcmpps_avx(local_b60,auVar92,5);
                auVar75 = vandps_avx(auVar75,ZEXT1632(auVar78));
                auVar54._4_4_ = fStack_9bc * auVar75._4_4_;
                auVar54._0_4_ = local_9c0 * auVar75._0_4_;
                auVar54._8_4_ = fStack_9b8 * auVar75._8_4_;
                auVar54._12_4_ = fStack_9b4 * auVar75._12_4_;
                auVar54._16_4_ = auVar75._16_4_ * 0.0;
                auVar54._20_4_ = auVar75._20_4_ * 0.0;
                auVar54._24_4_ = auVar75._24_4_ * 0.0;
                auVar54._28_4_ = 0;
                auVar88 = vminps_avx(auVar54,auVar102);
                auVar55._4_4_ = auVar73._4_4_ * auVar75._4_4_;
                auVar55._0_4_ = auVar73._0_4_ * auVar75._0_4_;
                auVar55._8_4_ = auVar73._8_4_ * auVar75._8_4_;
                auVar55._12_4_ = auVar73._12_4_ * auVar75._12_4_;
                auVar55._16_4_ = auVar75._16_4_ * 0.0;
                auVar55._20_4_ = auVar75._20_4_ * 0.0;
                auVar55._24_4_ = auVar75._24_4_ * 0.0;
                auVar55._28_4_ = auVar75._28_4_;
                auVar75 = vminps_avx(auVar55,auVar102);
                auVar84 = vsubps_avx(auVar102,auVar88);
                auVar40 = vsubps_avx(auVar102,auVar75);
                local_8c0 = vblendvps_avx(auVar75,auVar84,local_b80);
                local_8e0 = vblendvps_avx(auVar88,auVar40,local_b80);
                local_860._4_4_ = (float)local_ba0._4_4_ * local_940._4_4_;
                local_860._0_4_ = (float)local_ba0._0_4_ * local_940._0_4_;
                local_860._8_4_ = fStack_b98 * local_940._8_4_;
                local_860._12_4_ = fStack_b94 * local_940._12_4_;
                local_860._16_4_ = fStack_b90 * local_940._16_4_;
                local_860._20_4_ = fStack_b8c * local_940._20_4_;
                local_860._24_4_ = fStack_b88 * local_940._24_4_;
                local_860._28_4_ = local_8c0._28_4_;
                local_880[0] = local_960._0_4_ * (float)local_ba0._0_4_;
                local_880[1] = local_960._4_4_ * (float)local_ba0._4_4_;
                local_880[2] = local_960._8_4_ * fStack_b98;
                local_880[3] = local_960._12_4_ * fStack_b94;
                fStack_870 = local_960._16_4_ * fStack_b90;
                fStack_86c = local_960._20_4_ * fStack_b8c;
                fStack_868 = local_960._24_4_ * fStack_b88;
                uStack_864 = local_8e0._28_4_;
                local_840[0] = (float)local_ba0._0_4_ * fVar103;
                local_840[1] = (float)local_ba0._4_4_ * fVar107;
                local_840[2] = fStack_b98 * fVar108;
                local_840[3] = fStack_b94 * fVar109;
                fStack_830 = fStack_b90 * fVar110;
                fStack_82c = fStack_b8c * fVar111;
                fStack_828 = fStack_b88 * fVar112;
                uStack_824 = uStack_b84;
                auVar74 = vpacksswb_avx(auVar74,auVar74);
                uVar65 = (ulong)(byte)(SUB161(auVar74 >> 7,0) & 1 |
                                       (SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar74 >> 0x3f,0) << 7);
                do {
                  uVar61 = 0;
                  for (uVar64 = uVar65; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000
                      ) {
                    uVar61 = uVar61 + 1;
                  }
                  uVar60 = *(uint *)((long)&local_9e0 + uVar61 * 4);
                  pGVar11 = (pSVar5->geometries).items[uVar60].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar65 = uVar65 ^ 1L << (uVar61 & 0x3f);
                    bVar72 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar72 = false;
                  }
                  else {
                    local_ce0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar64 = (ulong)(uint)((int)uVar61 * 4);
                    uVar69 = *(undefined4 *)(local_8e0 + uVar64);
                    local_c00._4_4_ = uVar69;
                    local_c00._0_4_ = uVar69;
                    local_c00._8_4_ = uVar69;
                    local_c00._12_4_ = uVar69;
                    uVar69 = *(undefined4 *)(local_8c0 + uVar64);
                    local_bf0._4_4_ = uVar69;
                    local_bf0._0_4_ = uVar69;
                    local_bf0._8_4_ = uVar69;
                    local_bf0._12_4_ = uVar69;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar64);
                    local_cb0.context = context->user;
                    local_bd0._4_4_ = uVar60;
                    local_bd0._0_4_ = uVar60;
                    local_bd0._8_4_ = uVar60;
                    local_bd0._12_4_ = uVar60;
                    local_be0 = *(undefined4 *)((long)&local_a00 + uVar64);
                    local_c30 = *(undefined4 *)((long)local_880 + uVar64);
                    uVar69 = *(undefined4 *)(local_860 + uVar64);
                    local_c20._4_4_ = uVar69;
                    local_c20._0_4_ = uVar69;
                    local_c20._8_4_ = uVar69;
                    local_c20._12_4_ = uVar69;
                    uVar69 = *(undefined4 *)((long)local_840 + uVar64);
                    local_c10._4_4_ = uVar69;
                    local_c10._0_4_ = uVar69;
                    local_c10._8_4_ = uVar69;
                    local_c10._12_4_ = uVar69;
                    vpcmpeqd_avx2(ZEXT1632(local_bd0),ZEXT1632(local_bd0));
                    uStack_bbc = (local_cb0.context)->instID[0];
                    local_bc0 = uStack_bbc;
                    uStack_bb8 = uStack_bbc;
                    uStack_bb4 = uStack_bbc;
                    uStack_bb0 = (local_cb0.context)->instPrimID[0];
                    uStack_bac = uStack_bb0;
                    uStack_ba8 = uStack_bb0;
                    uStack_ba4 = uStack_bb0;
                    local_d10 = *local_d00;
                    uStack_d08 = local_d00[1];
                    local_cb0.valid = (int *)&local_d10;
                    local_cb0.geometryUserPtr = pGVar11->userPtr;
                    local_cb0.hit = (RTCHitN *)&local_c30;
                    local_cb0.N = 4;
                    local_cb0.ray = (RTCRayN *)ray;
                    uStack_c2c = local_c30;
                    uStack_c28 = local_c30;
                    uStack_c24 = local_c30;
                    uStack_bdc = local_be0;
                    uStack_bd8 = local_be0;
                    uStack_bd4 = local_be0;
                    if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar11->occlusionFilterN)(&local_cb0);
                    }
                    auVar74._8_8_ = uStack_d08;
                    auVar74._0_8_ = local_d10;
                    if (auVar74 == (undefined1  [16])0x0) {
                      auVar74 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar74 = auVar74 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_cb0);
                      }
                      auVar39._8_8_ = uStack_d08;
                      auVar39._0_8_ = local_d10;
                      auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,auVar39);
                      auVar74 = auVar73 ^ _DAT_01febe20;
                      auVar87._8_4_ = 0xff800000;
                      auVar87._0_8_ = 0xff800000ff800000;
                      auVar87._12_4_ = 0xff800000;
                      auVar73 = vblendvps_avx(auVar87,*(undefined1 (*) [16])(local_cb0.ray + 0x80),
                                              auVar73);
                      *(undefined1 (*) [16])(local_cb0.ray + 0x80) = auVar73;
                    }
                    auVar74 = vpslld_avx(auVar74,0x1f);
                    bVar58 = (auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar59 = (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar57 = (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar56 = -1 < auVar74[0xf];
                    bVar72 = ((bVar58 && bVar59) && bVar57) && bVar56;
                    if (((bVar58 && bVar59) && bVar57) && bVar56) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_ce0._0_4_;
                      uVar65 = uVar65 ^ 1L << (uVar61 & 0x3f);
                    }
                  }
                  if (!bVar72) {
                    uVar60 = 0;
                    if (bVar71) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar60 = 1;
                    }
                    goto LAB_0058718e;
                  }
                } while (uVar65 != 0);
              }
            }
          }
          uVar60 = 0;
          local_cf0 = local_cf0 + 1;
          bVar71 = local_cf0 < local_cf8;
        } while (local_cf0 != local_cf8);
      }
    }
LAB_0058718e:
  } while ((uVar60 & 3) == 0);
  return local_ce8 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }